

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O3

void __thiscall cppforth::Forth::interpret(Forth *this)

{
  ForthStack<unsigned_int> *this_00;
  Xt *pXVar1;
  pointer pcVar2;
  bool bVar3;
  Cell CVar4;
  Cell CVar5;
  Xt index;
  InterpretStates IVar6;
  Definition *pDVar7;
  string currentWord;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  undefined1 local_88 [32];
  _Alloc_hider local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58 [2];
  
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  index = 0;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            (&local_a8,0x21,'\0');
  this_00 = &this->dStack;
LAB_0012bbc3:
  IVar6 = this->InterpretState;
  if (IVar6 != InterpretSource) goto LAB_0012bcf8;
  skipSpacesInSource(this);
  CVar4 = dataSpaceAtCell(this,this->VarOffsetSourceSize);
  CVar5 = dataSpaceAtCell(this,this->VarOffsetSourceOffset);
  if ((int)(CVar4 - CVar5) < 1) {
    bVar3 = refillNextLine(this);
    if (!bVar3) {
      if ((this->savedInput).
          super__Vector_base<cppforth::Forth::structSavedInput,_std::allocator<cppforth::Forth::structSavedInput>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          (this->savedInput).
          super__Vector_base<cppforth::Forth::structSavedInput,_std::allocator<cppforth::Forth::structSavedInput>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
          operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
        }
        return;
      }
      RestoreInput(this);
      if ((this->InterpretState != InterpretWords) || (this->next_command == 0)) goto LAB_0012bcf2;
      index = dataSpaceAtCell(this,this->next_command);
      goto LAB_0012bcdb;
    }
    goto LAB_0012bcf2;
  }
  index = blWordFind(this,&local_a8);
  if (index == 0) goto LAB_0012bc94;
  CVar4 = dataSpaceAtCell(this,this->VarOffsetState);
  if ((CVar4 != 0) &&
     (pDVar7 = getDefinition(this,index), (pDVar7->flags & pDVar7->FlagImmediate) == 0)) {
    data(this,index);
    goto LAB_0012bcf2;
  }
  this->InterpretState = InterpretWords;
  goto LAB_0012bd01;
LAB_0012bc94:
  index = 0;
  if (local_a8._M_string_length != 0) {
    bVar3 = interpretNumbers(this,&local_a8);
    index = 0;
    if (!bVar3) {
      ForthStack<unsigned_int>::push(this_00,0xfffffff3);
      exceptionsThrow(this);
      index = dataSpaceAtCell(this,this->next_command);
LAB_0012bcdb:
      this->next_command = this->next_command + 4;
    }
LAB_0012bcf2:
    IVar6 = this->InterpretState;
LAB_0012bcf8:
    if (IVar6 == InterpretWords) {
LAB_0012bd01:
      pDVar7 = getDefinition(this,index);
      while (((code *)pDVar7->code == execute && (*(long *)&pDVar7->field_0x8 == 0))) {
        requireDStackDepth(this,1,"EXECUTE");
        index = ForthStack<unsigned_int>::getTop(this_00);
        ForthStack<unsigned_int>::pop(this_00);
        pDVar7 = getDefinition(this,index);
      }
      pDVar7 = getDefinition(this,index);
      local_88._0_4_ = (undefined4)pDVar7->code;
      local_88._4_4_ = *(undefined4 *)((long)&pDVar7->code + 4);
      local_88._8_4_ = *(undefined4 *)&pDVar7->field_0x8;
      local_88._12_4_ = *(undefined4 *)&pDVar7->field_0xc;
      local_88._16_4_ = pDVar7->does;
      local_88._20_4_ = pDVar7->parameter;
      local_88._24_4_ = pDVar7->flags;
      local_68._M_p = (pointer)local_58;
      pcVar2 = (pDVar7->name)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_68,pcVar2,pcVar2 + (pDVar7->name)._M_string_length);
      local_58[1]._0_4_ = pDVar7->numberInVector;
      local_58[1]._4_4_ = pDVar7->searchOrder;
      local_58[1]._8_4_ = pDVar7->FlagHidden;
      local_58[1]._12_4_ = pDVar7->FlagImmediate;
      executeDefinition(this,(Definition *)local_88);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_p != local_58) {
        operator_delete(local_68._M_p,local_58[0]._M_allocated_capacity + 1);
      }
      if (this->next_command == 0) {
        this->InterpretState = InterpretSource;
      }
      else {
        index = dataSpaceAtCell(this,this->next_command);
        pXVar1 = &this->next_command;
        *pXVar1 = *pXVar1 + 4;
        if (*pXVar1 != 0) goto LAB_0012bbc3;
      }
      this->InterpretState = InterpretSource;
    }
  }
  goto LAB_0012bbc3;
}

Assistant:

void interpret() {
			Xt xt{};
			std::string currentWord(33,0); // reserve at least 33 chars in word
			while (true){
				if (InterpretState == InterpretSource){
					skipSpacesInSource();
					if (getSourceBufferRemain() >0 ) {
						xt=blWordFind(currentWord);
						if (xt>0) {
							if (getIsCompiling() && !getDefinition(xt)->isImmediate()) {
								data(CELL(xt));
							}
							else {
								InterpretState = InterpretWords;
							}
						}
						else {
							if (currentWord.size() > 0) {
								if (!interpretNumbers(currentWord)){
									// uncomment during debug if information is needed about wrong words
									//std::cerr << "!!!Wrong word "<<currentWord<<std::endl;
									push(CELL(-13));
									exceptionsThrow();
									xt = getDataCell(next_command);
									next_command += sizeof(next_command);
								}
							}
							else {
								// read buffer empty
								// on next cycle go to 'refill' branch
								continue;
							}
						}
					}
					else {
						// 'refill' branch
						auto refillFlag = refillNextLine();
						// input sorce empty (no lines in input buffer, no lines in file, 
						// evaluate source ended, block ended) ?
						if (!refillFlag){  
							auto qty = savedInput.size();  	// if empty, check saved input sources
							if (qty > 0){					// if have saved source - restore it and run
								RestoreInput();
								if (InterpretState == InterpretWords){
									if (next_command != 0){
										xt = getDataCell(next_command);
										next_command += sizeof(next_command);
									}
								}
							}
							else {
								break; // all input buffers are empty. break and return from interpret()
							}
						}
					}
				}
				if (InterpretState == InterpretWords){
					auto defn = getDefinition(xt);
					while (defn->code == &Forth::execute) {
						REQUIRE_DSTACK_DEPTH(1, "EXECUTE");
						xt = dStack.getTop(); dStack.pop();
						defn = getDefinition(xt);
					}
#ifdef FORTHSCRIPTCPP_ENABLE_INTERNALDEBUGGER
					if (stepfunction){
						if (currentstep-- == 0){
							stepfunction(this, xt, next_command);
							currentstep = maxstep;
						}
					}
#endif
					executeDefinition(*getDefinition(xt));
					if (next_command == 0){
						InterpretState = InterpretSource;
					}
					else {
						xt = getDataCell(next_command);
						next_command += sizeof(next_command);
					}
					if (next_command == 0){
						InterpretState = InterpretSource;
					}
				}
			}
		}